

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallLeafHeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>::SmallLeafHeapBlockT
          (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *this,
          HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *bucket,
          ushort objectSize,ushort objectCount)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined8 *in_FS_OFFSET;
  ushort objectCount_local;
  ushort objectSize_local;
  HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *bucket_local;
  SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *this_local;
  
  SmallHeapBlockT<SmallAllocationBlockAttributes>::SmallHeapBlockT
            (&this->super_SmallHeapBlockT<SmallAllocationBlockAttributes>,&bucket->super_HeapBucket,
             objectSize,objectCount,SmallLeafBlockType);
  (this->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).super_HeapBlock._vptr_HeapBlock =
       (_func_int **)&PTR_WBSetBit_0047f388;
  if ((1 < objectCount) &&
     (uVar3 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetPageCount
                        (&this->super_SmallHeapBlockT<SmallAllocationBlockAttributes>),
     (uint)objectCount == (uVar3 << 0xc) / (uint)objectSize)) {
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  *(undefined4 *)*in_FS_OFFSET = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallLeafHeapBlock.cpp"
                     ,0x19,
                     "(objectCount > 1 && objectCount == (this->GetPageCount() * AutoSystemInfo::PageSize)/ objectSize)"
                     ,
                     "objectCount > 1 && objectCount == (this->GetPageCount() * AutoSystemInfo::PageSize)/ objectSize"
                    );
  if (bVar2) {
    *(undefined4 *)*in_FS_OFFSET = 0;
    return;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

SmallLeafHeapBlockT<SmallAllocationBlockAttributes>::SmallLeafHeapBlockT(HeapBucketT<SmallLeafHeapBlockT<SmallAllocationBlockAttributes>> * bucket, ushort objectSize, ushort objectCount)
    : Base(bucket, objectSize, objectCount, HeapBlock::HeapBlockType::SmallLeafBlockType)
{
    Assert(objectCount > 1 && objectCount == (this->GetPageCount() * AutoSystemInfo::PageSize)/ objectSize);
}